

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.h
# Opt level: O2

MessageLite * __thiscall
google::protobuf::internal::MessageCreator::PlacementNew<false,google::protobuf::MessageLite>
          (MessageCreator *this,MessageLite *prototype_for_func,MessageLite *prototype_for_copy,
          void *mem,Arena *arena)

{
  undefined4 *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  Tag TVar4;
  uint uVar5;
  intptr_t iVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  bool bVar13;
  string *psVar14;
  long lVar15;
  ulong uVar16;
  MessageLite *pMVar17;
  size_type sVar18;
  undefined8 uVar19;
  char *pcVar20;
  ulong uVar21;
  ulong uVar22;
  Arena **v1;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  void *local_58 [2];
  Arena *local_48;
  ulong local_40;
  MessageLite *local_38;
  
  local_58[0] = (void *)((ulong)mem % (ulong)this->alignment_);
  local_40 = local_40 & 0xffffffff00000000;
  local_48 = arena;
  psVar14 = absl::lts_20240722::log_internal::Check_EQImpl<unsigned_long,unsigned_int>
                      ((unsigned_long *)local_58,(uint *)&local_40,
                       "reinterpret_cast<uintptr_t>(mem) % alignment_ == 0u");
  if (psVar14 != (string *)0x0) {
    pcVar20 = (psVar14->_M_dataplus)._M_p;
    sVar18 = psVar14->_M_string_length;
    uVar19 = 0x4aa;
    goto LAB_0026fd2a;
  }
  TVar4 = this->tag_;
  if (TVar4 < kZeroInit) {
    pMVar17 = (MessageLite *)(*(this->field_3).func_)(prototype_for_func,mem,local_48);
    return pMVar17;
  }
  uVar5 = this->allocation_size_;
  uVar21 = (ulong)uVar5;
  local_38 = prototype_for_copy;
  if (TVar4 == kZeroInit) {
    bVar13 = std::
             all_of<char_const*,google::protobuf::internal::MessageCreator::PlacementNew<false,google::protobuf::MessageLite>(google::protobuf::MessageLite_const*,google::protobuf::MessageLite_const*,void*,google::protobuf::Arena*)const::_lambda(auto:1)_1_>
                       (prototype_for_copy + 1,(long)&prototype_for_copy->_vptr_MessageLite + uVar21
                       );
    if (!bVar13) {
      pcVar20 = "std::all_of(src + sizeof(MessageLite), src + size, [](auto c) { return c == 0; })";
      sVar18 = 0x51;
      uVar19 = 0x4c7;
      goto LAB_0026fd2a;
    }
    if (uVar5 < 0x21) {
      uVar23 = 0;
      uVar24 = 0;
      uVar25 = 0;
      uVar26 = 0;
      goto LAB_0026fb38;
    }
    if (uVar5 < 0x41) {
      uVar23 = 0;
      uVar24 = 0;
      uVar25 = 0;
      uVar26 = 0;
      *(undefined8 *)((long)mem + 0x10) = 0;
      *(undefined8 *)((long)mem + 0x18) = 0;
      puVar3 = (undefined8 *)((long)mem + (uVar21 - 0x10));
      *puVar3 = 0;
      puVar3[1] = 0;
      goto LAB_0026fb85;
    }
    lVar15 = (long)mem + 0x50;
    for (uVar16 = 0x50; uVar16 < uVar21; uVar16 = uVar16 + 0x40) {
      *(undefined8 *)(lVar15 + -0x10) = 0;
      *(undefined8 *)(lVar15 + -8) = 0;
      *(undefined8 *)(lVar15 + -0x20) = 0;
      *(undefined8 *)(lVar15 + -0x18) = 0;
      *(undefined8 *)(lVar15 + -0x30) = 0;
      *(undefined8 *)(lVar15 + -0x28) = 0;
      *(undefined8 *)(lVar15 + -0x40) = 0;
      *(undefined8 *)(lVar15 + -0x38) = 0;
      lVar15 = lVar15 + 0x40;
    }
    uVar23 = 0;
    uVar24 = 0;
    uVar25 = 0;
    uVar26 = 0;
    puVar3 = (undefined8 *)((long)mem + (uVar21 - 0x10));
    *puVar3 = 0;
    puVar3[1] = 0;
    puVar3 = (undefined8 *)((long)mem + (uVar21 - 0x20));
    *puVar3 = 0;
    puVar3[1] = 0;
    puVar3 = (undefined8 *)((long)mem + (uVar21 - 0x30));
    *puVar3 = 0;
    puVar3[1] = 0;
LAB_0026fc49:
    puVar1 = (undefined4 *)((long)mem + (uVar21 - 0x40));
    *puVar1 = uVar23;
    puVar1[1] = uVar24;
    puVar1[2] = uVar25;
    puVar1[3] = uVar26;
  }
  else {
    psVar14 = absl::lts_20240722::log_internal::Check_EQImpl_abi_cxx11_
                        ((int)TVar4,1,"+as_tag == +kMemcpy");
    if (psVar14 != (string *)0x0) {
      pcVar20 = (psVar14->_M_dataplus)._M_p;
      sVar18 = psVar14->_M_string_length;
      uVar19 = 0x4d8;
      goto LAB_0026fd2a;
    }
    if (uVar5 < 0x21) {
      puVar1 = (undefined4 *)((long)&prototype_for_copy[-1]._vptr_MessageLite + uVar21);
      uVar23 = *puVar1;
      uVar24 = puVar1[1];
      uVar25 = puVar1[2];
      uVar26 = puVar1[3];
LAB_0026fb38:
      puVar1 = (undefined4 *)((long)mem + (uVar21 - 0x10));
      *puVar1 = uVar23;
      puVar1[1] = uVar24;
      puVar1[2] = uVar25;
      puVar1[3] = uVar26;
    }
    else {
      if (0x40 < uVar5) {
        lVar15 = (long)mem + 0x50;
        for (uVar16 = 0x50; uVar16 < uVar21; uVar16 = uVar16 + 0x40) {
          puVar3 = (undefined8 *)((long)&prototype_for_copy[-4]._vptr_MessageLite + uVar16);
          uVar19 = *puVar3;
          uVar7 = puVar3[1];
          puVar3 = (undefined8 *)((long)&prototype_for_copy[-3]._vptr_MessageLite + uVar16);
          uVar8 = *puVar3;
          uVar9 = puVar3[1];
          puVar3 = (undefined8 *)((long)&prototype_for_copy[-2]._vptr_MessageLite + uVar16);
          uVar10 = *puVar3;
          uVar11 = puVar3[1];
          puVar3 = (undefined8 *)((long)&prototype_for_copy[-1]._vptr_MessageLite + uVar16);
          uVar12 = puVar3[1];
          *(undefined8 *)(lVar15 + -0x10) = *puVar3;
          *(undefined8 *)(lVar15 + -8) = uVar12;
          *(undefined8 *)(lVar15 + -0x20) = uVar10;
          *(undefined8 *)(lVar15 + -0x18) = uVar11;
          *(undefined8 *)(lVar15 + -0x30) = uVar8;
          *(undefined8 *)(lVar15 + -0x28) = uVar9;
          *(undefined8 *)(lVar15 + -0x40) = uVar19;
          *(undefined8 *)(lVar15 + -0x38) = uVar7;
          lVar15 = lVar15 + 0x40;
        }
        puVar1 = (undefined4 *)((long)&prototype_for_copy[-4]._vptr_MessageLite + uVar21);
        uVar23 = *puVar1;
        uVar24 = puVar1[1];
        uVar25 = puVar1[2];
        uVar26 = puVar1[3];
        puVar3 = (undefined8 *)((long)&prototype_for_copy[-3]._vptr_MessageLite + uVar21);
        uVar19 = *puVar3;
        uVar7 = puVar3[1];
        puVar3 = (undefined8 *)((long)&prototype_for_copy[-2]._vptr_MessageLite + uVar21);
        uVar8 = *puVar3;
        uVar9 = puVar3[1];
        puVar3 = (undefined8 *)((long)&prototype_for_copy[-1]._vptr_MessageLite + uVar21);
        uVar10 = puVar3[1];
        puVar2 = (undefined8 *)((long)mem + (uVar21 - 0x10));
        *puVar2 = *puVar3;
        puVar2[1] = uVar10;
        puVar3 = (undefined8 *)((long)mem + (uVar21 - 0x20));
        *puVar3 = uVar8;
        puVar3[1] = uVar9;
        puVar3 = (undefined8 *)((long)mem + (uVar21 - 0x30));
        *puVar3 = uVar19;
        puVar3[1] = uVar7;
        goto LAB_0026fc49;
      }
      iVar6 = prototype_for_copy[1]._internal_metadata_.ptr_;
      *(_func_int ***)((long)mem + 0x10) = prototype_for_copy[1]._vptr_MessageLite;
      *(intptr_t *)((long)mem + 0x18) = iVar6;
      puVar1 = (undefined4 *)((long)&prototype_for_copy[-2]._vptr_MessageLite + uVar21);
      uVar23 = *puVar1;
      uVar24 = puVar1[1];
      uVar25 = puVar1[2];
      uVar26 = puVar1[3];
      puVar3 = (undefined8 *)((long)&prototype_for_copy[-1]._vptr_MessageLite + uVar21);
      uVar19 = puVar3[1];
      puVar2 = (undefined8 *)((long)mem + (uVar21 - 0x10));
      *puVar2 = *puVar3;
      puVar2[1] = uVar19;
LAB_0026fb85:
      puVar1 = (undefined4 *)((long)mem + (uVar21 - 0x20));
      *puVar1 = uVar23;
      puVar1[1] = uVar24;
      puVar1[2] = uVar25;
      puVar1[3] = uVar26;
    }
  }
  arena_bits(this);
  uVar16 = arena_bits(this);
  while( true ) {
    if (uVar16 == 0) {
      *(_func_int ***)mem = local_38->_vptr_MessageLite;
      *(Arena **)((long)mem + 8) = local_48;
      return (MessageLite *)mem;
    }
    lVar15 = 0;
    if (uVar16 != 0) {
      for (; (uVar16 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
      }
    }
    uVar22 = (ulong)(uint)((int)lVar15 << 3);
    local_58[0] = (void *)(uVar22 + 8);
    local_40 = uVar21;
    psVar14 = absl::lts_20240722::log_internal::Check_LEImpl<unsigned_long,unsigned_long>
                        ((unsigned_long *)local_58,&local_40,"offset + sizeof(Arena*) <= size");
    if (psVar14 != (string *)0x0) break;
    v1 = (Arena **)(uVar22 + (long)mem);
    local_58[0] = (void *)0x0;
    psVar14 = absl::lts_20240722::log_internal::
              Check_EQImpl<google::protobuf::Arena*,decltype(nullptr)>
                        (v1,local_58,"*reinterpret_cast<Arena**>(dst + offset) == nullptr");
    if (psVar14 != (string *)0x0) {
      pcVar20 = (psVar14->_M_dataplus)._M_p;
      sVar18 = psVar14->_M_string_length;
      uVar19 = 0x500;
      goto LAB_0026fd2a;
    }
    *v1 = local_48;
    uVar16 = uVar16 & uVar16 - 1;
  }
  pcVar20 = (psVar14->_M_dataplus)._M_p;
  sVar18 = psVar14->_M_string_length;
  uVar19 = 0x4fd;
LAB_0026fd2a:
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_58,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/message_lite.h"
             ,uVar19,sVar18,pcVar20);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_58);
}

Assistant:

PROTOBUF_ALWAYS_INLINE inline MessageLite* MessageCreator::PlacementNew(
    const MessageLite* prototype_for_func,
    const MessageLite* prototype_for_copy, void* mem, Arena* arena) const {
  ABSL_DCHECK_EQ(reinterpret_cast<uintptr_t>(mem) % alignment_, 0u);
  const Tag as_tag = tag();
  // When the feature is not enabled we skip the `as_tag` check since it is
  // unnecessary. Except for testing, where we want to test the copy logic even
  // when we can't use it for real messages.
  constexpr bool kMustBeFunc = !test_call && !internal::EnableCustomNew();
  static_assert(kFunc < 0 && !(kZeroInit < 0) && !(kMemcpy < 0),
                "Only kFunc must be the only negative value");
  if (ABSL_PREDICT_FALSE(kMustBeFunc || as_tag < 0)) {
    PROTOBUF_DEBUG_COUNTER("MessageCreator.Func").Inc();
    return static_cast<MessageLite*>(func_(prototype_for_func, mem, arena));
  }

  char* dst = static_cast<char*>(mem);
  const size_t size = allocation_size_;
  const char* src = reinterpret_cast<const char*>(prototype_for_copy);

  // These are a bit more efficient than calling normal memset/memcpy because:
  //  - We know the minimum size is 16. We have a fallback for when it is not.
  //  - We can "underflow" the buffer because those are the MessageLite bytes
  //    we will set later.
#ifndef PROTO2_OPENSOURCE
  // This manual handling shows a 1.85% improvement in the parsing
  // microbenchmark.
  // TODO: Verify this is still the case.
#endif  // !PROTO2_OPENSOUCE
  if (as_tag == kZeroInit) {
    // Make sure the input is really all zeros.
    ABSL_DCHECK(std::all_of(src + sizeof(MessageLite), src + size,
                            [](auto c) { return c == 0; }));

    if (sizeof(MessageLite) != 16) {
      memset(dst, 0, size);
    } else if (size <= 32) {
      memset(dst + size - 16, 0, 16);
    } else if (size <= 64) {
      memset(dst + 16, 0, 16);
      memset(dst + size - 32, 0, 32);
    } else {
      for (size_t offset = 16; offset + 64 < size; offset += 64) {
        absl::PrefetchToLocalCacheForWrite(dst + offset + 64);
        memset(dst + offset, 0, 64);
      }
      memset(dst + size - 64, 0, 64);
    }
  } else {
    ABSL_DCHECK_EQ(+as_tag, +kMemcpy);

    if (sizeof(MessageLite) != 16) {
      memcpy(dst, src, size);
    } else if (size <= 32) {
      memcpy(dst + size - 16, src + size - 16, 16);
    } else if (size <= 64) {
      memcpy(dst + 16, src + 16, 16);
      memcpy(dst + size - 32, src + size - 32, 32);
    } else {
      for (size_t offset = 16; offset + 64 < size; offset += 64) {
        absl::PrefetchToLocalCache(src + offset + 64);
        absl::PrefetchToLocalCacheForWrite(dst + offset + 64);
        memcpy(dst + offset, src + offset, 64);
      }
      memcpy(dst + size - 64, src + size - 64, 64);
    }
  }

  if (arena_bits() != 0) {
    if (as_tag == kZeroInit) {
      PROTOBUF_DEBUG_COUNTER("MessageCreator.ZeroArena").Inc();
    } else {
      PROTOBUF_DEBUG_COUNTER("MessageCreator.McpyArena").Inc();
    }
  } else {
    if (as_tag == kZeroInit) {
      PROTOBUF_DEBUG_COUNTER("MessageCreator.Zero").Inc();
    } else {
      PROTOBUF_DEBUG_COUNTER("MessageCreator.Mcpy").Inc();
    }
  }

  if (internal::PerformDebugChecks() || arena != nullptr) {
    if (uintptr_t offsets = arena_bits()) {
      do {
        const size_t offset = absl::countr_zero(offsets) * sizeof(Arena*);
        ABSL_DCHECK_LE(offset + sizeof(Arena*), size);
        // Verify we are overwriting a null pointer. If we are not, there is a
        // bug somewhere.
        ABSL_DCHECK_EQ(*reinterpret_cast<Arena**>(dst + offset), nullptr);
        memcpy(dst + offset, &arena, sizeof(arena));
        offsets &= offsets - 1;
      } while (offsets != 0);
    }
  }

  // The second memcpy overwrites part of the first, but the compiler should
  // avoid the double-write. It's easier than trying to avoid the overlap.
  memcpy(dst, static_cast<const void*>(prototype_for_copy),
         sizeof(MessageLite));
  memcpy(dst + PROTOBUF_FIELD_OFFSET(MessageLite, _internal_metadata_), &arena,
         sizeof(arena));
  return Launder(reinterpret_cast<MessageLite*>(mem));
}